

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O0

err_t bignOidToDER(octet *der,size_t *count,char *oid)

{
  bool_t bVar1;
  char *oid_00;
  octet *in_RDX;
  size_t *in_RSI;
  void *in_RDI;
  size_t len;
  char *in_stack_ffffffffffffffd8;
  
  bVar1 = strIsValid((char *)in_RDX);
  if (((bVar1 != 0) && (bVar1 = memIsValid(in_RSI,8), bVar1 != 0)) &&
     ((in_RDI == (void *)0x0 || (bVar1 = memIsValid(in_RDI,*in_RSI), bVar1 != 0)))) {
    oid_00 = (char *)oidToDER(in_RDX,in_stack_ffffffffffffffd8);
    if (oid_00 == (char *)0xffffffffffffffff) {
      return 0x12d;
    }
    if (in_RDI != (void *)0x0) {
      if ((char *)*in_RSI < oid_00) {
        return 0x6e;
      }
      oid_00 = (char *)oidToDER(in_RDX,oid_00);
    }
    *in_RSI = (size_t)oid_00;
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t bignOidToDER(octet der[], size_t* count, const char* oid)
{
	size_t len;
	if (!strIsValid(oid) || 
		!memIsValid(count, O_PER_S) ||
		!memIsNullOrValid(der, *count))
		return ERR_BAD_INPUT;
	len = oidToDER(0, oid);
	if (len == SIZE_MAX)
		return ERR_BAD_OID;
	if (der)
	{
		if (*count < len)
			return ERR_OUTOFMEMORY;
		len = oidToDER(der, oid);
		ASSERT(len != SIZE_MAX);
	}
	*count = len;
	return ERR_OK;
}